

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_int64(basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
           int64_t val,semantic_tag tag,ser_context *param_4,error_code *param_5)

{
  byte bVar1;
  char cVar2;
  unsigned_short uVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  char in_DL;
  basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_RSI;
  int64_t nanoseconds_1;
  int64_t seconds_1;
  ldiv_t dv_1;
  int64_t nanoseconds;
  int64_t seconds;
  ldiv_t dv;
  binary_stream_sink *in_stack_fffffffffffffec8;
  basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>
  *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffedc;
  uint8_t ch;
  binary_stream_sink *in_stack_fffffffffffffee0;
  basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this_00;
  unsigned_short in_stack_fffffffffffffeee;
  char val_01;
  short val_00;
  back_insert_iterator<jsoncons::binary_stream_sink> in_stack_fffffffffffffef0;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first;
  undefined4 in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  back_insert_iterator<jsoncons::binary_stream_sink> in_stack_ffffffffffffff00;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first_00;
  int64_t in_stack_ffffffffffffff10;
  int64_t in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  
  ch = (uint8_t)((uint)in_stack_fffffffffffffedc >> 0x18);
  if (in_DL == '\x05') {
    write_timestamp((basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                    CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  }
  else if (in_DL == '\x06') {
    if (in_RSI == (basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)0x0)
    {
      write_timestamp((basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    }
    else {
      std::div((int)in_RSI,1000);
      write_timestamp((basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    }
  }
  else if (in_DL == '\a') {
    if (in_RSI == (basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)0x0)
    {
      write_timestamp((basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    }
    else {
      std::div((int)in_RSI,1000000000);
      write_timestamp((basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    }
  }
  else {
    val_00 = (short)in_RSI;
    if ((long)in_RSI < 0) {
      if ((long)in_RSI < -0x20) {
        d_first_00.container = (binary_stream_sink *)in_RSI;
        cVar2 = std::numeric_limits<signed_char>::lowest();
        val_01 = (char)(in_stack_fffffffffffffeee >> 8);
        if ((long)d_first_00.container < (long)cVar2) {
          d_first.container = (binary_stream_sink *)in_RSI;
          sVar4 = std::numeric_limits<short>::lowest();
          if ((long)d_first.container < (long)sVar4) {
            this_00 = in_RSI;
            iVar6 = std::numeric_limits<int>::lowest();
            if ((long)this_00 < (long)iVar6) {
              in_stack_fffffffffffffed0 = in_RSI;
              lVar7 = std::numeric_limits<long>::lowest();
              if (lVar7 <= (long)in_stack_fffffffffffffed0) {
                binary_stream_sink::push_back((binary_stream_sink *)this_00,ch);
                std::back_inserter<jsoncons::binary_stream_sink>((binary_stream_sink *)in_RSI);
                binary::
                native_to_big<long,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                          (CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),d_first_00)
                ;
              }
            }
            else {
              binary_stream_sink::push_back((binary_stream_sink *)this_00,ch);
              std::back_inserter<jsoncons::binary_stream_sink>(in_stack_fffffffffffffec8);
              binary::
              native_to_big<int,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                        (in_stack_fffffffffffffefc,d_first_00);
            }
          }
          else {
            binary_stream_sink::push_back(in_stack_fffffffffffffee0,ch);
            std::back_inserter<jsoncons::binary_stream_sink>(in_stack_fffffffffffffec8);
            binary::
            native_to_big<short,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                      (val_00,d_first);
          }
        }
        else {
          binary_stream_sink::push_back(in_stack_fffffffffffffee0,ch);
          std::back_inserter<jsoncons::binary_stream_sink>(in_stack_fffffffffffffec8);
          binary::
          native_to_big<signed_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                    (val_01,in_stack_fffffffffffffef0);
        }
      }
      else {
        std::back_inserter<jsoncons::binary_stream_sink>(in_stack_fffffffffffffec8);
        binary::
        native_to_big<signed_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                  ((char)(in_stack_fffffffffffffeee >> 8),in_stack_fffffffffffffef0);
      }
    }
    else if ((long)in_RSI < 0x80) {
      binary_stream_sink::push_back(in_stack_fffffffffffffee0,ch);
    }
    else {
      bVar1 = std::numeric_limits<unsigned_char>::max();
      if ((long)(ulong)bVar1 < (long)in_RSI) {
        uVar3 = std::numeric_limits<unsigned_short>::max();
        if ((long)(ulong)uVar3 < (long)in_RSI) {
          uVar5 = std::numeric_limits<unsigned_int>::max();
          if ((long)(ulong)uVar5 < (long)in_RSI) {
            lVar7 = std::numeric_limits<long>::max();
            if ((long)in_RSI <= lVar7) {
              binary_stream_sink::push_back(in_stack_fffffffffffffee0,ch);
              std::back_inserter<jsoncons::binary_stream_sink>(in_stack_fffffffffffffec8);
              binary::
              native_to_big<unsigned_long,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                        (CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         in_stack_ffffffffffffff00);
            }
          }
          else {
            binary_stream_sink::push_back(in_stack_fffffffffffffee0,ch);
            std::back_inserter<jsoncons::binary_stream_sink>(in_stack_fffffffffffffec8);
            binary::
            native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                      (in_stack_fffffffffffffefc,in_stack_ffffffffffffff00);
          }
        }
        else {
          binary_stream_sink::push_back(in_stack_fffffffffffffee0,ch);
          std::back_inserter<jsoncons::binary_stream_sink>(in_stack_fffffffffffffec8);
          binary::
          native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                    (in_stack_fffffffffffffeee,in_stack_fffffffffffffef0);
        }
      }
      else {
        binary_stream_sink::push_back(in_stack_fffffffffffffee0,ch);
        binary_stream_sink::push_back(in_stack_fffffffffffffee0,ch);
      }
    }
  }
  end_value(in_stack_fffffffffffffed0);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_int64(int64_t val, 
            semantic_tag tag, 
            const ser_context&,
            std::error_code&) final
        {
            switch (tag)
            {
                case semantic_tag::epoch_second:
                    write_timestamp(val, 0);
                    break;
                case semantic_tag::epoch_milli:
                {
                    if (val != 0)
                    {
                        auto dv = std::div(val,millis_in_second);
                        int64_t seconds = dv.quot;
                        int64_t nanoseconds = dv.rem*nanos_in_milli;
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                case semantic_tag::epoch_nano:
                {
                    if (val != 0)
                    {
                        auto dv = std::div(val,static_cast<int64_t>(nanos_in_second));
                        int64_t seconds = dv.quot;
                        int64_t nanoseconds = dv.rem;
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                default:
                {
                    if (val >= 0)
                    {
                        if (val <= 0x7f)
                        {
                            // positive fixnum stores 7-bit positive integer
                            sink_.push_back(static_cast<uint8_t>(val));
                        }
                        else if (val <= (std::numeric_limits<uint8_t>::max)())
                        {
                            // uint 8 stores a 8-bit unsigned integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::uint8_type);
                            sink_.push_back(static_cast<uint8_t>(val));
                        }
                        else if (val <= (std::numeric_limits<uint16_t>::max)())
                        {
                            // uint 16 stores a 16-bit big-endian unsigned integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::uint16_type);
                            binary::native_to_big(static_cast<uint16_t>(val),std::back_inserter(sink_));
                        }
                        else if (val <= (std::numeric_limits<uint32_t>::max)())
                        {
                            // uint 32 stores a 32-bit big-endian unsigned integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::uint32_type);
                            binary::native_to_big(static_cast<uint32_t>(val),std::back_inserter(sink_));
                        }
                        else if (val <= (std::numeric_limits<int64_t>::max)())
                        {
                            // int 64 stores a 64-bit big-endian signed integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::uint64_type);
                            binary::native_to_big(static_cast<uint64_t>(val),std::back_inserter(sink_));
                        }
                    }
                    else
                    {
                        if (val >= -32)
                        {
                            // negative fixnum stores 5-bit negative integer
                            binary::native_to_big(static_cast<int8_t>(val), std::back_inserter(sink_));
                        }
                        else if (val >= (std::numeric_limits<int8_t>::lowest)())
                        {
                            // int 8 stores a 8-bit signed integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::int8_type);
                            binary::native_to_big(static_cast<int8_t>(val),std::back_inserter(sink_));
                        }
                        else if (val >= (std::numeric_limits<int16_t>::lowest)())
                        {
                            // int 16 stores a 16-bit big-endian signed integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::int16_type);
                            binary::native_to_big(static_cast<int16_t>(val),std::back_inserter(sink_));
                        }
                        else if (val >= (std::numeric_limits<int32_t>::lowest)())
                        {
                            // int 32 stores a 32-bit big-endian signed integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::int32_type);
                            binary::native_to_big(static_cast<int32_t>(val),std::back_inserter(sink_));
                        }
                        else if (val >= (std::numeric_limits<int64_t>::lowest)())
                        {
                            // int 64 stores a 64-bit big-endian signed integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::int64_type);
                            binary::native_to_big(static_cast<int64_t>(val),std::back_inserter(sink_));
                        }
                    }
                }
                break;
            }
            end_value();
            JSONCONS_VISITOR_RETURN;
        }